

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_hamt_map.cpp
# Opt level: O2

void __thiscall
OneLevel_UpsertIteration_Test::OneLevel_UpsertIteration_Test(OneLevel_UpsertIteration_Test *this)

{
  anon_unknown.dwarf_13be9a::OneLevel::OneLevel(&this->super_OneLevel);
  (this->super_OneLevel).super_GenericIndexFixture.super_IndexFixture.super_Test._vptr_Test =
       (_func_int **)&PTR__OneLevel_00256d60;
  return;
}

Assistant:

TEST_F (OneLevel, UpsertIteration) {
    transaction_type t1 = begin (db_, lock_guard{mutex_});
    this->insert_or_assign (*index_, t1, "a");
    this->insert_or_assign (*index_, t1, "c");
    this->insert_or_assign (*index_, t1, "d");
    std::pair<test_trie::iterator, bool> itp = this->insert_or_assign (*index_, t1, "b");

    // Check trie iterator in the heap.
    test_trie::iterator begin = itp.first;
    test_trie::iterator end = index_->end (db_);
    EXPECT_NE (begin, end);

    std::string const v1 = (*begin).first;
    EXPECT_EQ ("b", v1);
    ++begin;
    std::string const & v2 = (*begin).first;
    EXPECT_EQ ("a", v2);
    ++begin;
    std::string const & v3 = (*begin).first;
    EXPECT_EQ ("c", v3);
    ++begin;
    std::string const & v4 = (*begin).first;
    EXPECT_EQ ("d", v4);
    ++begin;
    EXPECT_EQ (begin, end);

    index_->flush (t1, db_.get_current_revision ());
    itp = this->insert_or_assign (*index_, t1, "b");
    begin = itp.first;

    std::string const v5 = begin->first;
    EXPECT_EQ ("b", v5);
    ++begin;
    std::string const v6 = begin->first;
    EXPECT_EQ ("a", v6);
    ++begin;
    std::string const v7 = begin->first;
    EXPECT_EQ ("c", v7);
    ++begin;
    std::string const v8 = begin->first;
    EXPECT_EQ ("d", v8);
    ++begin;
    EXPECT_EQ (begin, end);
}